

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_UInt32 tt_cmap6_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  uint uVar3;
  ushort *puVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  
  uVar2 = *pchar_code + 1;
  if (0xffff < uVar2) {
    return 0;
  }
  pFVar1 = cmap->data;
  uVar7 = (uint)pFVar1[6] * 0x100 + (uint)pFVar1[7];
  if (uVar2 <= uVar7) {
    uVar2 = uVar7;
  }
  uVar3 = (uint)(ushort)(*(ushort *)(pFVar1 + 8) << 8 | *(ushort *)(pFVar1 + 8) >> 8);
  if (uVar2 - uVar7 < uVar3) {
    puVar4 = (ushort *)(pFVar1 + (ulong)((uVar2 - uVar7) * 2) + 10);
    do {
      uVar5 = *puVar4 << 8 | *puVar4 >> 8;
      if (uVar5 != 0) {
        uVar7 = (uint)uVar5;
        goto LAB_002453b7;
      }
      if (0xfffe < uVar2) {
        return 0;
      }
      iVar6 = uVar2 - CONCAT11(pFVar1[6],pFVar1[7]);
      uVar2 = uVar2 + 1;
      puVar4 = puVar4 + 1;
    } while (iVar6 + 1U < uVar3);
  }
  uVar7 = 0;
  uVar2 = 0;
LAB_002453b7:
  *pchar_code = uVar2;
  return uVar7;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap6_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_Byte*   table     = cmap->data;
    FT_UInt32  result    = 0;
    FT_UInt32  char_code = *pchar_code + 1;
    FT_UInt    gindex    = 0;

    FT_Byte*   p         = table + 6;
    FT_UInt    start     = TT_NEXT_USHORT( p );
    FT_UInt    count     = TT_NEXT_USHORT( p );
    FT_UInt    idx;


    if ( char_code >= 0x10000UL )
      return 0;

    if ( char_code < start )
      char_code = start;

    idx = (FT_UInt)( char_code - start );
    p  += 2 * idx;

    for ( ; idx < count; idx++ )
    {
      gindex = TT_NEXT_USHORT( p );
      if ( gindex != 0 )
      {
        result = char_code;
        break;
      }

      if ( char_code >= 0xFFFFU )
        return 0;

      char_code++;
    }

    *pchar_code = result;
    return gindex;
  }